

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::GetCurrentNetwork
          (PersistentStorageJson *this,NetworkId *aNwkId)

{
  bool bVar1;
  NetworkId NVar2;
  reference pvVar3;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_30;
  NetworkId local_1c;
  NetworkId *local_18;
  NetworkId *aNwkId_local;
  PersistentStorageJson *this_local;
  
  local_18 = aNwkId;
  aNwkId_local = (NetworkId *)this;
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                    (&this->mCache,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     JSON_CURR_NWK_abi_cxx11_);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](&this->mCache,(key_type *)JSON_CURR_NWK_abi_cxx11_);
    NVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::operator_NetworkId<ot::commissioner::persistent_storage::NetworkId,_0>(pvVar3);
    local_18->mId = NVar2.mId;
  }
  else {
    NetworkId::NetworkId(&local_1c);
    local_18->mId = local_1c.mId;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    basic_json<ot::commissioner::persistent_storage::NetworkId_&,_ot::commissioner::persistent_storage::NetworkId,_0>
              (&local_30,local_18);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](&this->mCache,(key_type *)JSON_CURR_NWK_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(pvVar3,&local_30);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_30);
  }
  return kSuccess;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::GetCurrentNetwork(NetworkId &aNwkId)
{
    if (!mCache.contains(JSON_CURR_NWK))
    {
        aNwkId                = NetworkId{};
        mCache[JSON_CURR_NWK] = aNwkId;
    }
    else
    {
        aNwkId = mCache[JSON_CURR_NWK];
    }
    return PersistentStorage::Status::kSuccess;
}